

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O1

void __thiscall Volume::simplePreVisualize(Volume *this,Mat *src,Point *obs)

{
  pointer pOVar1;
  pointer pEVar2;
  size_t sVar3;
  _Elt_pointer pMVar4;
  _Elt_pointer pMVar5;
  pointer this_00;
  long *local_a8 [2];
  long local_98 [2];
  undefined8 local_88;
  Point local_80;
  char str [8];
  _InputArray local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  this_00 = (this->objs).super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar1 = (this->objs).super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pOVar1) {
    do {
      local_80 = *obs;
      Object::visualizeEdges(this_00,src,&local_80);
      snprintf(str,8,"%d",(ulong)(uint)this_00->id);
      local_70.sz.width = 0;
      local_70.sz.height = 0;
      local_70.flags = 0x3010000;
      local_a8[0] = local_98;
      local_70.obj = src;
      sVar3 = strlen(str);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,str,str + sVar3);
      pEVar2 = (this_00->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar4 = ((iterator *)
               ((long)&(pEVar2->
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ).
                       super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl + 0x30))->_M_cur;
      pMVar5 = pMVar4;
      if (pMVar4 == *(_Elt_pointer *)
                     ((long)&(pEVar2->
                             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ).
                             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl + 0x38)) {
        pMVar5 = (*(_Map_pointer *)
                   ((long)&(pEVar2->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl + 0x48))[-1] + 0x15;
        pMVar4 = (*(_Map_pointer *)
                   ((long)&(pEVar2->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl + 0x48))[-1] + 0x15;
      }
      local_88 = CONCAT44((int)*(double *)
                                ((long)&pMVar4[-1].
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data + 8) + 10,
                          (int)pMVar5[-1].
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[0] + 10);
      local_58 = ZEXT816(0x406fe00000000000) << 0x40;
      local_48 = ZEXT816(0x406fe00000000000);
      cv::putText(0x3ff8000000000000,&local_70,local_a8,&local_88,1,local_58,1,8,0);
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0],local_98[0] + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pOVar1);
  }
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"tmp","");
  local_70.sz.width = 0;
  local_70.sz.height = 0;
  local_70.flags = 0x1010000;
  local_70.obj = src;
  cv::imshow((string *)local_a8,&local_70);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  cv::waitKey(0);
  return;
}

Assistant:

void Volume::simplePreVisualize(cv::Mat& src, const cv::Point& obs) const {
    for (const Object& obj: objs) {
        obj.visualizeEdges(src, obs);
        char str[8];
        snprintf(str, 8, "%d", obj.id);
		cv::putText(src, str, cv::Point(obj.edges.front().back().x(), obj.edges.front().back().y()) + cv::Point(10, 10),
				cv::FONT_HERSHEY_PLAIN, 1.5, cv::Scalar(0, 255, 255));
    }
    cv::imshow("tmp", src);
    cv::waitKey(0);
}